

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O0

void __thiscall FNotifyBuffer::Tick(FNotifyBuffer *this)

{
  uint uVar1;
  FNotifyText *pFVar2;
  uint local_14;
  uint i;
  FNotifyBuffer *this_local;
  
  if (this->Top < this->TopGoal) {
    this->Top = this->Top + 1;
  }
  else if (this->TopGoal < this->Top) {
    this->Top = this->Top + -1;
  }
  local_14 = 0;
  while ((uVar1 = TArray<FNotifyText,_FNotifyText>::Size(&this->Text), local_14 < uVar1 &&
         ((pFVar2 = TArray<FNotifyText,_FNotifyText>::operator[](&this->Text,(ulong)local_14),
          pFVar2->TimeOut == 0 ||
          (pFVar2 = TArray<FNotifyText,_FNotifyText>::operator[](&this->Text,(ulong)local_14),
          pFVar2->TimeOut <= gametic))))) {
    local_14 = local_14 + 1;
  }
  if (local_14 != 0) {
    TArray<FNotifyText,_FNotifyText>::Delete(&this->Text,0,local_14);
  }
  return;
}

Assistant:

void FNotifyBuffer::Tick()
{
	if (TopGoal > Top)
	{
		Top++;
	}
	else if (TopGoal < Top)
	{
		Top--;
	}

	// Remove lines from the beginning that have expired.
	unsigned i;
	for (i = 0; i < Text.Size(); ++i)
	{
		if (Text[i].TimeOut != 0 && Text[i].TimeOut > gametic)
			break;
	}
	if (i > 0)
	{
		Text.Delete(0, i);
	}
}